

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.h
# Opt level: O0

void __thiscall
Liby::BinaryHeap<Liby::WeakTimerHolder>::delete_min(BinaryHeap<Liby::WeakTimerHolder> *this)

{
  uint uVar1;
  bool bVar2;
  reference pvVar3;
  reference this_00;
  vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_> *this_01;
  WeakTimerHolder local_58;
  BinaryHeap<Liby::WeakTimerHolder> *local_10;
  BinaryHeap<Liby::WeakTimerHolder> *this_local;
  
  local_10 = this;
  bVar2 = empty(this);
  if (bVar2) {
    __cxa_rethrow();
  }
  this_01 = &this->heap;
  uVar1 = this->size_;
  this->size_ = uVar1 - 1;
  pvVar3 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::operator[]
                     (this_01,(ulong)uVar1);
  this_00 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::operator[]
                      (this_01,1);
  WeakTimerHolder::operator=(this_00,pvVar3);
  percolate_down(this,1);
  local_58.timer_.handler_._M_invoker = (_Invoker_type)0x0;
  local_58.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.timer_.handler_.super__Function_base._M_functor._8_8_ = 0;
  local_58.timer_.handler_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_58.timer_.timeout_.tv_.tv_usec = 0;
  local_58.timer_.handler_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_58.timer_.id_ = 0;
  local_58.timer_.timeout_.tv_.tv_sec = 0;
  local_58.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  WeakTimerHolder::WeakTimerHolder(&local_58);
  pvVar3 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::operator[]
                     (this_01,(ulong)(this->size_ + 1));
  WeakTimerHolder::operator=(pvVar3,&local_58);
  WeakTimerHolder::~WeakTimerHolder(&local_58);
  return;
}

Assistant:

void delete_min() {
        if (empty())
            throw;

        heap[1] = heap[size_--];
        percolate_down(1);
        heap[size_ + 1] = T(); // 使删除小端后的堆的末尾的多余的一个元素被清零
    }